

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

uint32_t FAudioSourceVoice_Discontinuity(FAudioSourceVoice *voice)

{
  code *pcVar1;
  int iVar2;
  uint32_t uVar3;
  long in_RDI;
  SDL_AssertState sdl_assert_state;
  FAudioBufferEntry *buf;
  uint *local_10;
  
  do {
    if (*(int *)(in_RDI + 0xc) == 0) goto LAB_001291e9;
    iVar2 = SDL_ReportAssertion(&FAudioSourceVoice_Discontinuity::sdl_assert_data,
                                "FAudioSourceVoice_Discontinuity",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio.c"
                                ,0xa74);
  } while (iVar2 == 0);
  if (iVar2 == 1) {
    pcVar1 = (code *)swi(3);
    uVar3 = (*pcVar1)();
    return uVar3;
  }
LAB_001291e9:
  FAudio_PlatformLockMutex((FAudioMutex)0x1291fa);
  if (*(long *)(in_RDI + 0x130) != 0) {
    for (local_10 = *(uint **)(in_RDI + 0x130); *(long *)(local_10 + 0xe) != 0;
        local_10 = *(uint **)(local_10 + 0xe)) {
    }
    *local_10 = *local_10 | 0x40;
  }
  FAudio_PlatformUnlockMutex((FAudioMutex)0x129255);
  return 0;
}

Assistant:

uint32_t FAudioSourceVoice_Discontinuity(
	FAudioSourceVoice *voice
) {
	FAudioBufferEntry *buf;

	LOG_API_ENTER(voice->audio)
	FAudio_assert(voice->type == FAUDIO_VOICE_SOURCE);

	FAudio_PlatformLockMutex(voice->src.bufferLock);
	LOG_MUTEX_LOCK(voice->audio, voice->src.bufferLock)

	if (voice->src.bufferList != NULL)
	{
		for (buf = voice->src.bufferList; buf->next != NULL; buf = buf->next);
		buf->buffer.Flags |= FAUDIO_END_OF_STREAM;
	}

	FAudio_PlatformUnlockMutex(voice->src.bufferLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->src.bufferLock)
	LOG_API_EXIT(voice->audio)
	return 0;
}